

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O1

void __thiscall
LinkedReadsDatastore::LinkedReadsDatastore
          (LinkedReadsDatastore *this,WorkSpace *ws,LinkedReadsDatastore *o)

{
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  LinkedReadsMapper::LinkedReadsMapper(&this->mapper,ws,this);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->default_name)._M_dataplus._M_p = (pointer)&(this->default_name).field_2;
  (this->default_name)._M_string_length = 0;
  (this->default_name).field_2._M_local_buf[0] = '\0';
  (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->fd = (FILE *)0x0;
  this->ws = ws;
  std::vector<long,_std::allocator<long>_>::operator=
            (&(this->mapper).read_to_node,&(o->mapper).read_to_node);
  std::
  vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
  ::operator=(&(this->mapper).reads_in_node,&(o->mapper).reads_in_node);
  std::
  vector<std::vector<TagNeighbour,_std::allocator<TagNeighbour>_>,_std::allocator<std::vector<TagNeighbour,_std::allocator<TagNeighbour>_>_>_>
  ::operator=(&(this->mapper).tag_neighbours,&(o->mapper).tag_neighbours);
  return;
}

Assistant:

LinkedReadsDatastore::LinkedReadsDatastore(WorkSpace &ws, const LinkedReadsDatastore &o) : ws(ws), mapper(ws, *this) {
    mapper.read_to_node = o.mapper.read_to_node;
    mapper.reads_in_node = o.mapper.reads_in_node;
    mapper.tag_neighbours = o.mapper.tag_neighbours;
}